

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O0

void __thiscall VW::SpanningTree::SpanningTree(SpanningTree *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  string *pmessage;
  undefined8 uVar5;
  char *in_RDI;
  char __errmsg_2 [256];
  stringstream __msg_2;
  sockaddr_in address;
  char __errmsg_1 [256];
  stringstream __msg_1;
  int on;
  char __errmsg [256];
  stringstream __msg;
  string *in_stack_fffffffffffff7a8;
  undefined8 in_stack_fffffffffffff7b0;
  int plineNumber;
  undefined7 in_stack_fffffffffffff7c0;
  undefined1 in_stack_fffffffffffff7c7;
  undefined1 uVar6;
  char local_818 [256];
  stringstream local_718 [16];
  ostream local_708 [380];
  sockaddr local_58c;
  undefined1 local_579;
  char local_558 [256];
  stringstream local_458 [16];
  ostream local_448 [376];
  undefined4 local_2d0;
  undefined1 local_2c9;
  char local_2a8 [280];
  stringstream local_190 [16];
  ostream local_180 [384];
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20);
  *in_RDI = '\0';
  in_RDI[8] = -0x51;
  in_RDI[9] = 'g';
  in_RDI[0x10] = '\0';
  in_RDI[0x11] = '\0';
  in_RDI[0x12] = '\0';
  in_RDI[0x13] = '\0';
  in_RDI[0x14] = '\0';
  in_RDI[0x15] = '\0';
  in_RDI[0x16] = '\0';
  in_RDI[0x17] = '\0';
  iVar1 = socket(2,1,0);
  *(int *)(in_RDI + 4) = iVar1;
  if (*(int *)(in_RDI + 4) < 0) {
    std::__cxx11::stringstream::stringstream(local_190);
    std::operator<<(local_180,"socket: ");
    piVar2 = __errno_location();
    pcVar3 = strerror_r(*piVar2,local_2a8,0x100);
    if (pcVar3 == (char *)0x0) {
      poVar4 = std::operator<<(local_180,"errno = ");
      std::operator<<(poVar4,local_2a8);
      plineNumber = (int)((ulong)poVar4 >> 0x20);
    }
    else {
      std::operator<<(local_180,"errno = unknown");
    }
    local_2c9 = 1;
    pmessage = (string *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    vw_exception::vw_exception
              ((vw_exception *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),in_RDI,
               plineNumber,pmessage);
    local_2c9 = 0;
    __cxa_throw(pmessage,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  local_2d0 = 1;
  iVar1 = setsockopt(*(int *)(in_RDI + 4),1,2,&local_2d0,4);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_458);
    std::operator<<(local_448,"setsockopt SO_REUSEADDR: ");
    piVar2 = __errno_location();
    pcVar3 = strerror_r(*piVar2,local_558,0x100);
    if (pcVar3 == (char *)0x0) {
      poVar4 = std::operator<<(local_448,"errno = ");
      std::operator<<(poVar4,local_558);
    }
    else {
      std::operator<<(local_448,"errno = unknown");
    }
    local_579 = 1;
    uVar5 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    vw_exception::vw_exception
              ((vw_exception *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),in_RDI,
               plineNumber,in_stack_fffffffffffff7a8);
    local_579 = 0;
    __cxa_throw(uVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  local_58c.sa_family = 2;
  local_58c.sa_data._2_4_ = htonl(0);
  local_58c.sa_data._0_2_ = htons(*(uint16_t *)(in_RDI + 8));
  iVar1 = bind(*(int *)(in_RDI + 4),&local_58c,0x10);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_718);
    std::operator<<(local_708,"bind: ");
    piVar2 = __errno_location();
    pcVar3 = strerror_r(*piVar2,local_818,0x100);
    if (pcVar3 == (char *)0x0) {
      poVar4 = std::operator<<(local_708,"errno = ");
      std::operator<<(poVar4,local_818);
    }
    else {
      std::operator<<(local_708,"errno = unknown");
    }
    uVar6 = 1;
    uVar5 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    vw_exception::vw_exception
              ((vw_exception *)CONCAT17(uVar6,in_stack_fffffffffffff7c0),in_RDI,plineNumber,
               in_stack_fffffffffffff7a8);
    __cxa_throw(uVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  return;
}

Assistant:

SpanningTree::SpanningTree() : m_stop(false), port(26543), m_future(nullptr)
{
#ifdef _WIN32
  WSAData wsaData;
  int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
  if (lastError != 0)
    THROWERRNO("WSAStartup() returned error:" << lastError);
#endif

  sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock < 0)
    THROWERRNO("socket: ");

  int on = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
    THROWERRNO("setsockopt SO_REUSEADDR: ");

  sockaddr_in address;
  address.sin_family = AF_INET;
  address.sin_addr.s_addr = htonl(INADDR_ANY);

  address.sin_port = htons(port);
  if (::bind(sock, (sockaddr*)&address, sizeof(address)) < 0)
    THROWERRNO("bind: ");
}